

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.c
# Opt level: O2

void sprite(dw_rom *rom,char *sprite_name)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  code *local_2f8;
  code *local_2f0;
  code *local_2e8;
  code *local_2e0;
  code *local_2d8;
  code *local_2d0;
  code *local_2c8;
  code *local_2c0;
  code *local_2b8;
  code *local_2b0;
  code *local_2a8;
  code *local_2a0;
  code *local_298;
  code *local_290;
  code *local_288;
  code *local_280;
  code *local_278;
  code *local_270;
  code *local_268;
  code *local_260;
  code *local_258;
  code *local_250;
  code *local_248;
  code *local_240;
  code *local_238;
  code *local_230;
  code *local_228;
  code *local_220;
  code *local_218;
  code *local_210;
  code *local_208;
  code *local_200;
  code *local_1f8;
  code *local_1f0;
  code *local_1e8;
  code *local_1e0;
  code *local_1d8;
  code *local_1d0;
  code *local_1c8;
  code *local_1c0;
  code *local_1b8;
  code *local_1b0;
  code *local_1a8;
  code *local_1a0;
  code *local_198;
  code *local_190;
  code *local_188;
  code *local_180;
  code *local_178;
  code *local_170;
  code *local_168;
  code *local_160;
  code *local_158;
  code *local_150;
  code *local_148;
  code *local_140;
  code *local_138;
  code *local_130;
  code *local_128;
  code *local_120;
  code *local_118;
  code *local_110;
  code *local_108;
  code *local_100;
  code *local_f8;
  code *local_f0;
  code *local_e8;
  code *local_e0;
  code *local_d8;
  code *local_d0;
  code *local_c8;
  code *local_c0;
  code *local_b8;
  code *local_b0;
  code *local_a8;
  code *local_a0;
  code *local_98;
  code *local_90;
  code *local_88;
  code *local_80;
  code *local_78;
  code *local_70;
  code *local_68;
  code *local_60;
  code *local_58;
  undefined8 uStack_50;
  dw_rom *local_40;
  code **local_38;
  
  uStack_50 = 0x57;
  if (sprite_count_i == '\0') {
    sprite_count_i = '\x01';
  }
  local_38 = &local_2f8;
  if ((rom->flags[9] & 0xc) != 0) {
    return;
  }
  local_2f8 = gwaelin;
  local_2f0 = slime;
  local_2e8 = red_slime;
  local_2e0 = metal_slime;
  local_2d8 = dragonlord;
  local_2d0 = dw2_cannock;
  local_2c8 = dw2_midenhall;
  local_2c0 = dw2_moonbrooke;
  local_2b8 = dw3_female_fighter;
  local_2b0 = dw3_male_fighter;
  local_2a8 = dw3_female_goof_off;
  local_2a0 = dw3_male_goof_off;
  local_298 = dw3_ghost;
  local_290 = dw3_hero;
  local_288 = dw3_female_merchant;
  local_280 = dw3_male_merchant;
  local_278 = dw3_female_pilgrim;
  local_270 = dw3_male_pilgrim;
  local_268 = dw3_female_sage;
  local_260 = dw3_male_sage;
  local_258 = dw3_female_soldier;
  local_250 = dw3_male_soldier;
  local_248 = dw3_female_wizard;
  local_240 = dw3_male_wizard;
  local_238 = dw4_alena;
  local_230 = dw4_brey;
  local_228 = dw4_celia;
  local_220 = dw4_cristo;
  local_218 = doran;
  local_210 = dw4_healie;
  local_208 = dw4_heroine;
  local_200 = dw4_hero;
  local_1f8 = dw4_mara;
  local_1f0 = dw4_nara;
  local_1e8 = dw4_ragnar;
  local_1e0 = dw4_taloon;
  local_1d8 = dw4_tov_the_dog;
  local_1d0 = dw4_yeti;
  local_1c8 = ff_black_belt;
  local_1c0 = ff_black_mage;
  local_1b8 = ff_black_wizard;
  local_1b0 = ff_fighter;
  local_1a8 = ff_knight;
  local_1a0 = ff_master;
  local_198 = ff_ninja;
  local_190 = ff_red_mage;
  local_188 = ff_red_wizard;
  local_180 = ff_thief;
  local_178 = ff_white_mage;
  local_170 = ff_white_wizard;
  local_168 = ff4_cecil;
  local_160 = ff4_edge;
  local_158 = link;
  local_150 = mario;
  local_148 = luigi;
  local_140 = yoshi;
  local_138 = wario;
  local_130 = waluigi;
  local_128 = pacman;
  local_120 = ms_pacman;
  local_118 = inky;
  local_110 = blinky;
  local_108 = pinky;
  local_100 = clyde;
  local_f8 = sue;
  local_f0 = blaster_master;
  local_e8 = bomberman;
  local_e0 = christine;
  local_d8 = kirby;
  local_d0 = lala;
  local_c8 = lolo;
  local_c0 = st_mike;
  local_b8 = mina_the_hollower;
  local_b0 = plumplim;
  local_a8 = guanyu;
  local_a0 = zhangfei;
  local_98 = zhaoyun;
  local_90 = huangzhong;
  local_88 = machao;
  local_80 = zhugeliang;
  local_78 = jiangwei;
  local_70 = lubu;
  local_68 = bo_jackson;
  local_60 = jerry_rice;
  local_58 = barry_sanders;
  local_40 = rom;
  iVar1 = strcmp("Random",sprite_name);
  uVar3 = 0;
  if (sprite_count_i != '\0') {
    uVar3 = 0x57;
  }
  if (iVar1 == 0) {
    if (sprite_count_i == '\0') {
      sprite_count_i = '\x01';
      uVar3 = 0x57;
    }
    uVar2 = mt_rand(2,uVar3 - 1);
    sprite_name = dwr_sprite_names[uVar2];
  }
  else {
    uVar2 = 2;
    while( true ) {
      if (uVar3 == 0) {
        sprite_count_i = '\x01';
        uVar3 = 0x57;
      }
      if (uVar3 <= uVar2) {
        return;
      }
      iVar1 = strcmp(dwr_sprite_names[uVar2],sprite_name);
      if (iVar1 == 0) break;
      uVar2 = uVar2 + 1;
    }
  }
  printf("Setting player sprite to %s...\n",sprite_name);
  (*local_38[uVar2 - 2])(local_40);
  return;
}

Assistant:

void sprite(dw_rom *rom, const char *sprite_name)
{
    void (*sprite_func[sprite_count()-2])(dw_rom *rom);
    size_t i=0;

    if (INVISIBLE_HERO(rom)) {
        return;
    }

    sprite_func[i++] = &gwaelin;
    sprite_func[i++] = &slime;
    sprite_func[i++] = &red_slime;
    sprite_func[i++] = &metal_slime;
    sprite_func[i++] = &dragonlord;

    sprite_func[i++] = &dw2_cannock;
    sprite_func[i++] = &dw2_midenhall;
    sprite_func[i++] = &dw2_moonbrooke;

    sprite_func[i++] = &dw3_female_fighter;
    sprite_func[i++] = &dw3_male_fighter;

    sprite_func[i++] = &dw3_female_goof_off;
    sprite_func[i++] = &dw3_male_goof_off;
    sprite_func[i++] = &dw3_ghost;
    sprite_func[i++] = &dw3_hero;
    sprite_func[i++] = &dw3_female_merchant;
    sprite_func[i++] = &dw3_male_merchant;
    sprite_func[i++] = &dw3_female_pilgrim;
    sprite_func[i++] = &dw3_male_pilgrim;
    sprite_func[i++] = &dw3_female_sage;
    sprite_func[i++] = &dw3_male_sage;
    sprite_func[i++] = &dw3_female_soldier;
    sprite_func[i++] = &dw3_male_soldier;
    sprite_func[i++] = &dw3_female_wizard;
    sprite_func[i++] = &dw3_male_wizard;

    sprite_func[i++] = &dw4_alena;
    sprite_func[i++] = &dw4_brey;
    sprite_func[i++] = &dw4_celia;
    sprite_func[i++] = &dw4_cristo;
    sprite_func[i++] = &doran;
    sprite_func[i++] = &dw4_healie;
    sprite_func[i++] = &dw4_heroine;
    sprite_func[i++] = &dw4_hero;
    sprite_func[i++] = &dw4_mara;
    sprite_func[i++] = &dw4_nara;
    sprite_func[i++] = &dw4_ragnar;
    sprite_func[i++] = &dw4_taloon;
    sprite_func[i++] = &dw4_tov_the_dog;
    sprite_func[i++] = &dw4_yeti;

    sprite_func[i++] = &ff_black_belt;
    sprite_func[i++] = &ff_black_mage;
    sprite_func[i++] = &ff_black_wizard;
    sprite_func[i++] = &ff_fighter;
    sprite_func[i++] = &ff_knight;
    sprite_func[i++] = &ff_master;
    sprite_func[i++] = &ff_ninja;
    sprite_func[i++] = &ff_red_mage;
    sprite_func[i++] = &ff_red_wizard;
    sprite_func[i++] = &ff_thief;
    sprite_func[i++] = &ff_white_mage;
    sprite_func[i++] = &ff_white_wizard;
    sprite_func[i++] = &ff4_cecil;
    sprite_func[i++] = &ff4_edge;

    sprite_func[i++] = &link;
    sprite_func[i++] = &mario;
    sprite_func[i++] = &luigi;
    sprite_func[i++] = &yoshi;
    sprite_func[i++] = &wario;
    sprite_func[i++] = &waluigi;

    sprite_func[i++] = &pacman;
    sprite_func[i++] = &ms_pacman;
    sprite_func[i++] = &inky;
    sprite_func[i++] = &blinky;
    sprite_func[i++] = &pinky;
    sprite_func[i++] = &clyde;
    sprite_func[i++] = &sue;

    sprite_func[i++] = &blaster_master;
    sprite_func[i++] = &bomberman;
    sprite_func[i++] = &christine;
    sprite_func[i++] = &kirby;
    sprite_func[i++] = &lala;
    sprite_func[i++] = &lolo;
    sprite_func[i++] = &st_mike;

    sprite_func[i++] = &mina_the_hollower;

    sprite_func[i++] = &plumplim;

    sprite_func[i++] = &guanyu;
    sprite_func[i++] = &zhangfei;
    sprite_func[i++] = &zhaoyun;
    sprite_func[i++] = &huangzhong;
    sprite_func[i++] = &machao;
    sprite_func[i++] = &zhugeliang;
    sprite_func[i++] = &jiangwei;
    sprite_func[i++] = &lubu;

    sprite_func[i++] = &bo_jackson;
    sprite_func[i++] = &jerry_rice;
    sprite_func[i++] = &barry_sanders;

    if (!strcmp("Random", sprite_name)) {

        i = mt_rand(2, sprite_count()-1);
        printf("Setting player sprite to %s...\n", dwr_sprite_names[i]);
        (*sprite_func[i-2])(rom);
    } else {
        for (i=2; i < sprite_count(); i++) {
            if (!strcmp(dwr_sprite_names[i], sprite_name)) {
                printf("Setting player sprite to %s...\n", sprite_name);
                (*sprite_func[i-2])(rom);
                break;
            }
        }
    }
}